

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O0

void ggml_opt_forward_backward(ggml_opt_context_t opt_ctx,ggml_opt_result *result)

{
  int iVar1;
  ggml_opt_context_t in_RSI;
  long in_RDI;
  int32_t opt_i_next;
  ggml_opt_result *in_stack_000000f0;
  ggml_cgraph *in_stack_000000f8;
  ggml_opt_context_t in_stack_00000100;
  
  if (*(int *)(in_RDI + 0x1420) == 1) {
    ggml_opt_eval_graph(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
  }
  else {
    iVar1 = (*(int *)(in_RDI + 0x1424) + 1) % *(int *)(in_RDI + 0x1420);
    if (iVar1 == 0) {
      ggml_opt_eval_graph(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
      ggml_opt_reset(in_RSI,SUB41((uint)iVar1 >> 0x18,0));
    }
    else {
      ggml_opt_eval_graph(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
    }
    *(int *)(in_RDI + 0x1424) = iVar1;
  }
  return;
}

Assistant:

void ggml_opt_forward_backward(ggml_opt_context_t opt_ctx, ggml_opt_result * result) {
    if (opt_ctx->opt_period == 1) {
        ggml_opt_eval_graph(opt_ctx, opt_ctx->gb_opt, result);
        return;
    }

    const int32_t opt_i_next = (opt_ctx->opt_i + 1) % opt_ctx->opt_period;
    if (opt_i_next == 0) {
        ggml_opt_eval_graph(opt_ctx, opt_ctx->gb_opt, result);
        ggml_opt_reset(opt_ctx, /*optimizer =*/ false);
    } else {
        ggml_opt_eval_graph(opt_ctx, opt_ctx->gb_grad, result);
    }
    opt_ctx->opt_i = opt_i_next;
}